

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int secp256k1_memcmp_var(void *s1,void *s2,size_t n)

{
  int iVar1;
  int diff;
  size_t i;
  uchar *p2;
  uchar *p1;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  i = 0;
  while( true ) {
    if (n <= i) {
      return 0;
    }
    iVar1 = (uint)*(byte *)((long)s1 + i) - (uint)*(byte *)((long)s2 + i);
    if (iVar1 != 0) break;
    i = i + 1;
  }
  return iVar1;
}

Assistant:

static SECP256K1_INLINE int secp256k1_memcmp_var(const void *s1, const void *s2, size_t n) {
    const unsigned char *p1 = s1, *p2 = s2;
    size_t i;

    for (i = 0; i < n; i++) {
        int diff = p1[i] - p2[i];
        if (diff != 0) {
            return diff;
        }
    }
    return 0;
}